

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O0

ostream * toml::operator<<(ostream *os,local_date *date)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  short *in_RSI;
  ostream *in_RDI;
  
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(in_RDI,_Var1._M_c);
  _Var2 = CLI::std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)*in_RSI);
  std::operator<<(poVar3,'-');
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(in_RDI,_Var1._M_c);
  _Var2 = CLI::std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(byte *)(in_RSI + 1) + 1);
  std::operator<<(poVar3,'-');
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(in_RDI,_Var1._M_c);
  _Var2 = CLI::std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,(uint)*(byte *)((long)in_RSI + 3));
  return in_RDI;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const local_date& date)
{
    os << std::setfill('0') << std::setw(4) << static_cast<int>(date.year )     << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.month) + 1 << '-';
    os << std::setfill('0') << std::setw(2) << static_cast<int>(date.day  )    ;
    return os;
}